

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

size_t __thiscall
CoreML::Specification::RandomNormalStaticLayerParams::ByteSizeLong
          (RandomNormalStaticLayerParams *this)

{
  size_t sVar1;
  ulong uVar2;
  long lVar3;
  size_t sVar4;
  
  sVar1 = google::protobuf::internal::WireFormatLite::UInt64Size(&this->outputshape_);
  if (sVar1 == 0) {
    lVar3 = 0;
  }
  else {
    uVar2 = (long)(int)sVar1 | 1;
    lVar3 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    lVar3 = (ulong)((int)lVar3 * 9 + 0x49U >> 6) + 1;
  }
  (this->_outputshape_cached_byte_size_).super___atomic_base<int>._M_i = (int)sVar1;
  sVar1 = lVar3 + sVar1;
  if (this->seed_ != 0) {
    uVar2 = this->seed_ | 1;
    lVar3 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    sVar1 = sVar1 + ((int)lVar3 * 9 + 0x89U >> 6);
  }
  sVar4 = sVar1 + 5;
  if (this->mean_ == 0.0) {
    sVar4 = sVar1;
  }
  sVar1 = sVar4 + 5;
  if (this->stddev_ == 0.0) {
    sVar1 = sVar4;
  }
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    sVar1 = sVar1 + *(long *)((uVar2 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar1;
  return sVar1;
}

Assistant:

size_t RandomNormalStaticLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.RandomNormalStaticLayerParams)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated uint64 outputShape = 4;
  {
    size_t data_size = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      UInt64Size(this->outputshape_);
    if (data_size > 0) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
            static_cast<int32_t>(data_size));
    }
    int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(data_size);
    _outputshape_cached_byte_size_.store(cached_size,
                                    std::memory_order_relaxed);
    total_size += data_size;
  }

  // int64 seed = 1;
  if (this->_internal_seed() != 0) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int64SizePlusOne(this->_internal_seed());
  }

  // float mean = 2;
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_mean = this->_internal_mean();
  uint32_t raw_mean;
  memcpy(&raw_mean, &tmp_mean, sizeof(tmp_mean));
  if (raw_mean != 0) {
    total_size += 1 + 4;
  }

  // float stdDev = 3;
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_stddev = this->_internal_stddev();
  uint32_t raw_stddev;
  memcpy(&raw_stddev, &tmp_stddev, sizeof(tmp_stddev));
  if (raw_stddev != 0) {
    total_size += 1 + 4;
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}